

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O0

void __thiscall
TestParser_TestSubExpr_Test::~TestParser_TestSubExpr_Test(TestParser_TestSubExpr_Test *this)

{
  TestParser_TestSubExpr_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(TestParser, TestSubExpr) {
    Parser parser(Lexer("a - b"));
    std::unique_ptr<AST::Stmt> stmt = parser.parse();
    auto* exprStmt = dynamic_cast<AST::ExprStmt*>(stmt.get());
    std::unique_ptr<AST::Expr> expr = std::move(exprStmt->m_expr);
    auto* subExpr = dynamic_cast<AST::BinaryExpr*>(expr.get());
    ASSERT_EQ(subExpr->m_op, TokenType::Minus);
    std::unique_ptr<AST::Expr> left = std::move(subExpr->m_left);
    auto* lident = dynamic_cast<AST::Identifier*>(left.get());
    std::unique_ptr<AST::Expr> right = std::move(subExpr->m_right);
    auto* rident = dynamic_cast<AST::Identifier*>(right.get());
    ASSERT_EQ(lident->m_identStr, "a");
    ASSERT_EQ(rident->m_identStr, "b");
}